

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

double ** HTS_alloc_matrix(size_t x,size_t y)

{
  double *pdVar1;
  size_t in_RSI;
  ulong in_RDI;
  double **p;
  size_t i;
  size_t in_stack_ffffffffffffffe0;
  ulong size;
  double **local_8;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_8 = (double **)0x0;
  }
  else {
    local_8 = (double **)HTS_calloc(in_RSI,in_stack_ffffffffffffffe0);
    for (size = 0; size < in_RDI; size = size + 1) {
      pdVar1 = (double *)HTS_calloc(in_RSI,size);
      local_8[size] = pdVar1;
    }
  }
  return local_8;
}

Assistant:

double **HTS_alloc_matrix(size_t x, size_t y)
{
   size_t i;
   double **p;

   if (x == 0 || y == 0)
      return NULL;

   p = (double **) HTS_calloc(x, sizeof(double *));

   for (i = 0; i < x; i++)
      p[i] = (double *) HTS_calloc(y, sizeof(double));
   return p;
}